

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

shared_ptr<duckdb::ParquetFileMetadataCache,_true>
duckdb::LoadMetadata
          (ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  bool bVar1;
  ThriftFileTransport *this;
  undefined8 uVar2;
  idx_t in;
  optional_ptr<duckdb::ReadHead,_true> buffer;
  InvalidInputException *this_00;
  pointer pFVar3;
  pointer pTVar4;
  ParquetEncryptionConfig *this_01;
  pointer pFVar5;
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar6;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  geo_metadata;
  templated_unique_single_t crypto_metadata;
  templated_unique_single_t metadata;
  uint32_t read_footer_len;
  data_ptr_t data_ptr;
  optional_ptr<duckdb::ReadHead,_true> read_head;
  idx_t metadata_pos_1;
  idx_t total_footer_len;
  uint footer_len_1;
  idx_t metadata_pos;
  ClientContext *in_stack_00000240;
  FileMetaData *in_stack_00000248;
  uint32_t footer_len;
  ResizeableBuffer buf;
  bool footer_encrypted;
  idx_t file_size;
  ThriftFileTransport *transport;
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  file_proto;
  time_t current_time;
  ThriftFileTransport *in_stack_fffffffffffffca8;
  ResizeableBuffer *in_stack_fffffffffffffcb0;
  idx_t in_stack_fffffffffffffcb8;
  ThriftFileTransport *in_stack_fffffffffffffcc0;
  Allocator *in_stack_fffffffffffffcc8;
  ResizeableBuffer *in_stack_fffffffffffffcd0;
  type in_stack_fffffffffffffcd8;
  type in_stack_fffffffffffffce0;
  CachingFileHandle *in_stack_fffffffffffffce8;
  optional_idx *in_stack_fffffffffffffcf0;
  allocator *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  ReadHead *in_stack_fffffffffffffd20;
  EncryptionUtil *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  TProtocol *in_stack_fffffffffffffdc8;
  TBase *in_stack_fffffffffffffdd0;
  string local_228 [54];
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [32];
  string local_1d0 [8];
  bool *in_stack_fffffffffffffe38;
  uint32_t *in_stack_fffffffffffffe40;
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe58;
  string *file_path;
  data_ptr_t in_stack_fffffffffffffe60;
  allocator local_159;
  string local_158 [36];
  uint local_134;
  idx_t local_130;
  string local_128 [36];
  int local_104;
  int local_100;
  byte local_ca;
  undefined1 local_c9;
  allocator local_a1;
  string local_a0 [32];
  idx_t local_80;
  ThriftFileTransport *local_58;
  undefined8 local_48;
  time_t local_40;
  optional_idx local_10 [2];
  
  local_48 = std::chrono::_V2::system_clock::now();
  local_40 = std::chrono::_V2::system_clock::to_time_t((time_point *)in_stack_fffffffffffffcd0);
  CreateThriftFileProtocol
            (in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                *)in_stack_fffffffffffffcb0);
  duckdb_apache::thrift::protocol::TProtocol::getTransport((TProtocol *)in_stack_fffffffffffffca8);
  this = (ThriftFileTransport *)
         std::
         __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffcb0);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x69de13);
  local_58 = this;
  local_80 = ThriftFileTransport::GetSize(this);
  if (local_80 < 0xc) {
    local_c9 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"File \'%s\' too small to be a Parquet file",&local_a1);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              ((InvalidInputException *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
               in_stack_fffffffffffffd10);
    local_c9 = 0;
    __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  bVar1 = optional_idx::IsValid(local_10);
  if (bVar1) {
    in = optional_idx::GetIndex(in_stack_fffffffffffffcf0);
    local_134 = UnsafeNumericCast<unsigned_int,unsigned_long,void>(in);
    if ((local_134 == 0) || (local_80 < local_134 + 0xc)) {
      uVar2 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_158,"Invalid footer length provided for file \'%s\'",&local_159);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                ((InvalidInputException *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd10);
      __cxa_throw(uVar2,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    ThriftFileTransport::SetLocation(local_58,local_80 - (local_134 + 8));
    ThriftFileTransport::Prefetch
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               (uint64_t)in_stack_fffffffffffffcb0);
    buffer = ThriftFileTransport::GetReadHead(in_stack_fffffffffffffca8,0x69e36c);
    in_stack_fffffffffffffd20 =
         optional_ptr<duckdb::ReadHead,_true>::operator->
                   ((optional_ptr<duckdb::ReadHead,_true> *)in_stack_fffffffffffffcb0);
    file_path = (string *)in_stack_fffffffffffffd20->buffer_ptr;
    in_stack_fffffffffffffd18 = file_path + local_134;
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter((data_ptr_t)buffer.ptr,file_path,
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                      );
    std::__cxx11::string::~string(local_1d0);
    if (in_stack_fffffffffffffe54 != local_134) {
      local_1f2 = 1;
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      paVar7 = &local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f0,
                 "Parquet footer length stored in file is not equal to footer length provided",
                 paVar7);
      duckdb::InvalidInputException::InvalidInputException(this_00,local_1f0);
      local_1f2 = 0;
      __cxa_throw(this_00,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
  }
  else {
    ResizeableBuffer::ResizeableBuffer(in_stack_fffffffffffffcb0);
    ResizeableBuffer::resize
              (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
               (uint64_t)in_stack_fffffffffffffcc0);
    ByteBuffer::zero((ByteBuffer *)0x69dfef);
    ThriftFileTransport::Prefetch
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               (uint64_t)in_stack_fffffffffffffcb0);
    ThriftFileTransport::SetLocation(local_58,local_80 - 8);
    ThriftFileTransport::read(local_58,local_100,(void *)0x8,in_RCX);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                      );
    std::__cxx11::string::~string(local_128);
    local_130 = local_80 - (local_104 + 8);
    ThriftFileTransport::SetLocation(local_58,local_130);
    ThriftFileTransport::Prefetch
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
               (uint64_t)in_stack_fffffffffffffcb0);
    ResizeableBuffer::~ResizeableBuffer((ResizeableBuffer *)0x69e114);
  }
  make_uniq<duckdb_parquet::FileMetaData>();
  if ((local_ca & 1) == 0) {
    pFVar5 = unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                           *)in_stack_fffffffffffffcb0);
    pTVar4 = std::
             unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             ::get((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                    *)in_stack_fffffffffffffcb0);
    (**(code **)(*(long *)pFVar5 + 0x10))(pFVar5,pTVar4);
  }
  else {
    make_uniq<duckdb_parquet::FileCryptoMetaData>();
    pFVar3 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)in_stack_fffffffffffffcb0);
    pTVar4 = std::
             unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             ::get((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                    *)in_stack_fffffffffffffcb0);
    (**(code **)(*(long *)pFVar3 + 0x10))(pFVar3,pTVar4);
    pFVar3 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)in_stack_fffffffffffffcb0);
    if (((byte)(pFVar3->encryption_algorithm).__isset >> 1 & 1) != 0) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar7 = (allocator *)&stack0xfffffffffffffdd7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_228,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
                 paVar7);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                ((InvalidInputException *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                 in_stack_fffffffffffffd10);
      __cxa_throw(uVar2,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    in_stack_fffffffffffffce0 =
         unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
         ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                      *)in_stack_fffffffffffffcb0);
    in_stack_fffffffffffffcd8 =
         unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
         ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                      *)in_stack_fffffffffffffcb0);
    this_01 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->
                        ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)
                         in_stack_fffffffffffffcb0);
    ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_01);
    ParquetCrypto::Read(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
    ::~unique_ptr((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                   *)0x69e799);
  }
  unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
  ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
               *)in_stack_fffffffffffffcb0);
  GeoParquetFileMetadata::TryRead(in_stack_00000248,in_stack_00000240);
  make_shared_ptr<duckdb::ParquetFileMetadataCache,duckdb::unique_ptr<duckdb_parquet::FileMetaData,std::default_delete<duckdb_parquet::FileMetaData>,true>,long&,duckdb::unique_ptr<duckdb::GeoParquetFileMetadata,std::default_delete<duckdb::GeoParquetFileMetadata>,true>>
            ((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              *)in_stack_fffffffffffffce8,(long *)in_stack_fffffffffffffce0,
             (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              *)in_stack_fffffffffffffcd8);
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  ::~unique_ptr((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                 *)0x69e847);
  unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
  ::~unique_ptr((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                 *)0x69e854);
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  ::~unique_ptr((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                 *)0x69e861);
  sVar6.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar6.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - 8, 8);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, footer_len);
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}